

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O3

void refs_create(refs_table_t *tbl,size_t _refs_size)

{
  uint64_t *puVar1;
  refs_table_t *prVar2;
  
  if ((int)POPCOUNT(_refs_size) == 1) {
    tbl->refs_size = _refs_size;
    prVar2 = (refs_table_t *)0x0;
    puVar1 = (uint64_t *)mmap((void *)0x0,_refs_size * 8 + 0x3f & 0xffffffffffffffc0,3,0x22,-1,0);
    if (puVar1 == (uint64_t *)0xffffffffffffffff) {
      puVar1 = (uint64_t *)0x0;
    }
    tbl->refs_table = puVar1;
    tbl = prVar2;
    if (puVar1 != (uint64_t *)0x0) {
      return;
    }
  }
  else {
    refs_create_cold_1();
  }
  refs_create_cold_2();
  munmap(tbl->refs_table,tbl->refs_size * 8 + 0x3f & 0xffffffffffffffc0);
  return;
}

Assistant:

void
refs_create(refs_table_t *tbl, size_t _refs_size)
{
    if (__builtin_popcountll(_refs_size) != 1) {
        fprintf(stderr, "refs: Table size must be a power of 2!\n");
        exit(1);
    }

    tbl->refs_size = _refs_size;
    tbl->refs_table = (_Atomic(uint64_t)*)alloc_aligned(tbl->refs_size * sizeof(uint64_t));
    if (tbl->refs_table == 0) {
        fprintf(stderr, "refs: Unable to allocate memory: %s!\n", strerror(errno));
        exit(1);
    }
}